

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

void __thiscall
asio::detail::
read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::$_0>
::read_dynbuf_op<asio::basic_streambuf_ref<std::allocator<char>>>
          (read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
           *this,basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
                 *stream,basic_streambuf_ref<std::allocator<char>_> *buffers,
          transfer_exactly_t completion_condition,anon_class_8_1_8991fb9c_for_handler_ *handler)

{
  transfer_exactly_t in_RCX;
  basic_streambuf_ref<std::allocator<char>_> *in_RDX;
  size_t in_RSI;
  base_from_completion_cond<asio::detail::transfer_exactly_t> *in_RDI;
  size_t *in_R8;
  
  base_from_completion_cond<asio::detail::transfer_exactly_t>::base_from_completion_cond
            (in_RDI,in_RCX);
  in_RDI[1].completion_condition_.size_ = in_RSI;
  basic_streambuf_ref<std::allocator<char>_>::basic_streambuf_ref
            ((basic_streambuf_ref<std::allocator<char>_> *)(in_RDI + 2),in_RDX);
  *(undefined4 *)&in_RDI[3].completion_condition_.size_ = 0;
  in_RDI[4].completion_condition_.size_ = 0;
  in_RDI[5].completion_condition_.size_ = *in_R8;
  return;
}

Assistant:

read_dynbuf_op(AsyncReadStream& stream,
        ASIO_MOVE_ARG(BufferSequence) buffers,
        CompletionCondition completion_condition, ReadHandler& handler)
      : detail::base_from_completion_cond<
          CompletionCondition>(completion_condition),
        stream_(stream),
        buffers_(ASIO_MOVE_CAST(BufferSequence)(buffers)),
        start_(0),
        total_transferred_(0),
        handler_(ASIO_MOVE_CAST(ReadHandler)(handler))
    {
    }